

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> * __thiscall
Memory::
AllocateArray<Memory::NoCheckHeapAllocator,JsUtil::SimpleHashedEntry<Js::NumberPair,Js::NumberPair>,false>
          (Memory *this,NoCheckHeapAllocator *allocator,
          offset_in_NoCheckHeapAllocator_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair> *pIVar2;
  SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *pSVar3;
  SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *pSVar4;
  undefined8 uVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = count;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  if (((ulong)allocator & 1) != 0) {
    allocator = *(NoCheckHeapAllocator **)(allocator + *(long *)(this + AllocFunc) + -1);
  }
  pSVar3 = (SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *)
           (*(code *)allocator)(this + AllocFunc,uVar5);
  if (count != 0) {
    pSVar4 = pSVar3;
    do {
      pIVar2 = &(pSVar4->
                super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                ).super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>;
      (pIVar2->
      super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
      ).super_ValueEntryData<Js::NumberPair>.value.x = 0xffffffff;
      (pIVar2->
      super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
      ).super_ValueEntryData<Js::NumberPair>.value.y = 0xffffffff;
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar3 + count);
  }
  return pSVar3;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}